

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

void __thiscall
mapbox::detail::Earcut<unsigned_int>::eliminateHole
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  Node *a;
  Node *start;
  
  a = findHoleBridge(this,hole,outerNode);
  if (a != (Node *)0x0) {
    start = splitPolygon(this,a,hole);
    filterPoints(this,a,a->next);
    filterPoints(this,start,start->next);
    return;
  }
  return;
}

Assistant:

void Earcut<N>::eliminateHole(Node* hole, Node* outerNode) {
    outerNode = findHoleBridge(hole, outerNode);
    if (outerNode) {
        Node* b = splitPolygon(outerNode, hole);

        // filter out colinear points around cuts
        filterPoints(outerNode, outerNode->next);
        filterPoints(b, b->next);
    }
}